

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void P_BloodSplatter2(DVector3 *pos,AActor *originator,DAngle *hitangle)

{
  uint uVar1;
  int iVar2;
  uint32 uVar3;
  DWORD DVar4;
  PClassActor *type;
  AActor *pAVar5;
  bool bVar6;
  TAngle<double> local_90;
  TVector3<double> local_88;
  TFlags<ActorFlag2,_unsigned_int> local_6c;
  TVector3<double> local_68;
  AActor *local_50;
  AActor *mo;
  DVector2 add;
  int bloodtype;
  PClassActor *bloodcls;
  DAngle *pDStack_20;
  PalEntry bloodcolor;
  DAngle *hitangle_local;
  AActor *originator_local;
  DVector3 *pos_local;
  
  pDStack_20 = hitangle;
  bloodcls._4_4_ =
       (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
       AActor::GetBloodColor(originator);
  type = AActor::GetBloodType(originator,2);
  add.Y._4_4_ = FIntCVar::operator_cast_to_int(&cl_bloodtype);
  bVar6 = false;
  if (type != (PClassActor *)0x0) {
    pAVar5 = GetDefaultByType(&type->super_PClass);
    TFlags<ActorFlag4,_unsigned_int>::operator&
              ((TFlags<ActorFlag4,_unsigned_int> *)&add.Y,
               (int)pAVar5 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&add.Y);
    bVar6 = uVar1 == 0;
  }
  if (bVar6) {
    add.Y._4_4_ = 0;
  }
  TVector2<double>::TVector2((TVector2<double> *)&mo);
  iVar2 = FRandom::operator()(&pr_splat);
  mo = (AActor *)((double)(iVar2 + -0x80) / 32.0);
  iVar2 = FRandom::operator()(&pr_splat);
  add.X = (double)(iVar2 + -0x80) / 32.0;
  if (type != (PClassActor *)0x0) {
    operator+(&local_68,pos,(Vector2 *)&mo);
    local_50 = Spawn(type,&local_68,NO_REPLACE);
    TObjPtr<AActor>::operator=(&local_50->target,originator);
    uVar3 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)((long)&bloodcls + 4));
    bVar6 = false;
    if (uVar3 != 0) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_6c,(int)local_50 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_6c);
      bVar6 = uVar1 == 0;
    }
    if (bVar6) {
      DVar4 = TRANSLATION('\b',bloodcls._4_4_ >> 0x18);
      local_50->Translation = DVar4;
    }
    if (1 < add.Y._4_4_) {
      TFlags<ActorRenderFlag,_unsigned_int>::operator|=(&local_50->renderflags,RF_INVISIBLE);
    }
  }
  if (0 < add.Y._4_4_) {
    operator+(&local_88,pos,(Vector2 *)&mo);
    TAngle<double>::operator-(&local_90,180.0);
    uVar3 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)((long)&bloodcls + 4));
    P_DrawSplash2(0x28,&local_88,&local_90,2,uVar3);
  }
  return;
}

Assistant:

void P_BloodSplatter2 (const DVector3 &pos, AActor *originator, DAngle hitangle)
{
	PalEntry bloodcolor = originator->GetBloodColor();
	PClassActor *bloodcls = originator->GetBloodType(2);

	int bloodtype = cl_bloodtype;
	
	if (bloodcls != NULL && !(GetDefaultByType(bloodcls)->flags4 & MF4_ALLOWPARTICLES))
		bloodtype = 0;

	DVector2 add;
	add.X = (pr_splat() - 128) / 32.;
	add.Y = (pr_splat() - 128) / 32.;

	if (bloodcls != NULL)
	{
		AActor *mo;


		mo = Spawn (bloodcls, pos + add, NO_REPLACE); // GetBloodType already performed the replacement
		mo->target = originator;

		// colorize the blood!
		if (bloodcolor != 0 && !(mo->flags2 & MF2_DONTTRANSLATE))
		{
			mo->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
		}

		if (!(bloodtype <= 1)) mo->renderflags |= RF_INVISIBLE;
	}
	if (bloodtype >= 1)
	{
		P_DrawSplash2(40, pos + add, hitangle - 180., 2, bloodcolor);
	}
}